

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

bool __thiscall MakefileGenerator::writeDummyMakefile(MakefileGenerator *this,QTextStream *t)

{
  bool bVar1;
  QTextStream *pQVar2;
  ProString *str;
  const_iterator o;
  QTextStream *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  ProStringList *qut;
  ConstIterator it;
  ProKey *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  bool local_101;
  undefined1 local_100 [48];
  undefined1 local_d0 [24];
  const_iterator local_b8 [7];
  undefined1 local_80 [23];
  undefined1 in_stack_ffffffffffffff97;
  QTextStream *in_stack_ffffffffffffff98;
  MakefileGenerator *in_stack_ffffffffffffffa0;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (char *)in_stack_fffffffffffffe88);
  QMakeProject::values
            ((QMakeProject *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x1966fa);
  ProKey::~ProKey((ProKey *)0x19670b);
  if (bVar1) {
    local_101 = false;
  }
  else {
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"QMAKE    = ");
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                   (char *)in_stack_fffffffffffffe88);
    (**(code **)(*(long *)in_RDI + 0xb0))(local_50,in_RDI,local_80);
    QTextStream::operator<<(pQVar2,(QString *)local_50);
    ::operator<<((QTextStream *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                 (QTextStreamFunction)in_stack_fffffffffffffe88);
    QString::~QString((QString *)0x196795);
    ProKey::~ProKey((ProKey *)0x1967a2);
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                   (char *)in_stack_fffffffffffffe88);
    str = (ProString *)
          QMakeProject::values
                    ((QMakeProject *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe88);
    ProKey::~ProKey((ProKey *)0x1967fa);
    local_b8[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_b8[0] = QList<ProString>::begin
                            ((QList<ProString> *)
                             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    while( true ) {
      o = QList<ProString>::end
                    ((QList<ProString> *)
                     CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      bVar1 = QList<ProString>::const_iterator::operator!=(local_b8,o);
      if (!bVar1) break;
      QList<ProString>::const_iterator::operator*(local_b8);
      pQVar2 = ::operator<<(in_RDI,str);
      QTextStream::operator<<(pQVar2," ");
      QList<ProString>::const_iterator::operator++(local_b8);
    }
    pQVar2 = (QTextStream *)
             QTextStream::operator<<
                       (in_RSI,"first all clean install distclean uninstall qmake_all:\n\t");
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"@echo \"Some of the required modules (")
    ;
    ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                   (char *)in_stack_fffffffffffffe88);
    (**(code **)(*(long *)in_RDI + 0xb0))(local_d0,in_RDI,local_100);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)local_d0);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,") are not available.\"\n\t");
    QTextStream::operator<<(pQVar2,"@echo \"Skipped.\"\n\n");
    QString::~QString((QString *)0x19691c);
    ProKey::~ProKey((ProKey *)0x196926);
    writeMakeQmake(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                   (bool)in_stack_ffffffffffffff97);
    QTextStream::operator<<(in_RSI,"FORCE:\n\n");
    (**(code **)(*(long *)in_RDI + 0x38))(in_RDI,in_RSI);
    local_101 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_101;
  }
  __stack_chk_fail();
}

Assistant:

bool
MakefileGenerator::writeDummyMakefile(QTextStream &t)
{
    if (project->values("QMAKE_FAILED_REQUIREMENTS").isEmpty())
        return false;
    t << "QMAKE    = " << var("QMAKE_QMAKE") << Qt::endl;
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator it = qut.begin(); it != qut.end(); ++it)
        t << *it << " ";
    t << "first all clean install distclean uninstall qmake_all:\n\t"
      << "@echo \"Some of the required modules ("
      << var("QMAKE_FAILED_REQUIREMENTS") << ") are not available.\"\n\t"
      << "@echo \"Skipped.\"\n\n";
    writeMakeQmake(t);
    t << "FORCE:\n\n";
    suppressBuiltinRules(t);
    return true;
}